

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O2

pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> __thiscall
embree::VerifyScene::addSphereHair
          (VerifyScene *this,RandomSampler *sampler,RTCBuildQuality quality,Vec3fa *center,
          float radius,avector<Vec3fa> *motion_vector)

{
  Node *extraout_RDX;
  avector<Vec3fa> *in_R9;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> pVar2;
  Ref<embree::SceneGraph::Node> node;
  Node *local_38;
  Ref<embree::SceneGraph::Node> local_30;
  Ref<embree::SceneGraph::MaterialNode> local_28;
  Ref<embree::SceneGraph::Node> RVar1;
  
  local_28.ptr = (MaterialNode *)0x0;
  SceneGraph::createSphereShapedHair
            ((SceneGraph *)&local_38,(Vec3fa *)motion_vector,radius,&local_28);
  if (local_28.ptr != (MaterialNode *)0x0) {
    (*((local_28.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  if (in_R9->size_active != 0) {
    local_30.ptr = local_38;
    if (local_38 != (Node *)0x0) {
      (*(local_38->super_RefCount)._vptr_RefCount[2])();
    }
    SceneGraph::set_motion_vector(&local_30,in_R9);
    if (local_30.ptr != (Node *)0x0) {
      (*((local_30.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
  }
  pVar2 = addGeometry2(this,(RTCBuildQuality)sampler,
                       (Ref<embree::SceneGraph::Node> *)((ulong)center & 0xffffffff));
  RVar1 = pVar2.second.ptr;
  if (local_38 != (Node *)0x0) {
    (*(local_38->super_RefCount)._vptr_RefCount[3])();
    RVar1.ptr = extraout_RDX;
  }
  pVar2.second.ptr = RVar1.ptr;
  pVar2._0_8_ = this;
  return pVar2;
}

Assistant:

std::pair<unsigned,Ref<SceneGraph::Node>> addSphereHair (RandomSampler& sampler, RTCBuildQuality quality, const Vec3fa& center, const float radius, const avector<Vec3fa>& motion_vector = avector<Vec3fa>())
    {
      Ref<SceneGraph::Node> node = SceneGraph::createSphereShapedHair(center,radius);
      if (motion_vector.size()) SceneGraph::set_motion_vector(node,motion_vector);
      return addGeometry2(quality,node);
    }